

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_symmetrizing.cc
# Opt level: O3

void __thiscall
sptk::DataSymmetrizing::DataSymmetrizing
          (DataSymmetrizing *this,int fft_length,InputOutputFormats input_format,
          InputOutputFormats output_format)

{
  bool bVar1;
  int iVar2;
  
  this->_vptr_DataSymmetrizing = (_func_int **)&PTR__DataSymmetrizing_0010fcc8;
  this->fft_length_ = fft_length;
  this->input_format_ = input_format;
  this->output_format_ = output_format;
  iVar2 = fft_length;
  switch(input_format) {
  case kStandard:
    iVar2 = fft_length / 2 + 1;
    break;
  case kSymmetricForApplyingFourierTransform:
    break;
  case kSymmetricForPreservingFrequencyResponse:
  case kSymmetricForPlottingFrequencyResponse:
    iVar2 = fft_length + 1;
    break;
  default:
    iVar2 = 0;
  }
  this->input_length_ = iVar2;
  iVar2 = fft_length;
  switch(output_format) {
  case kStandard:
    iVar2 = fft_length / 2 + 1;
    break;
  case kSymmetricForApplyingFourierTransform:
    break;
  case kSymmetricForPreservingFrequencyResponse:
  case kSymmetricForPlottingFrequencyResponse:
    iVar2 = fft_length + 1;
    break;
  default:
    iVar2 = 0;
  }
  this->output_length_ = iVar2;
  this->is_valid_ = true;
  if ((((fft_length < 2) || (bVar1 = IsEven(fft_length), !bVar1)) || (this->input_length_ == 0)) ||
     (this->output_length_ == 0)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

DataSymmetrizing::DataSymmetrizing(int fft_length,
                                   InputOutputFormats input_format,
                                   InputOutputFormats output_format)
    : fft_length_(fft_length),
      input_format_(input_format),
      output_format_(output_format),
      input_length_(CalculateDataLength(fft_length_, input_format_)),
      output_length_(CalculateDataLength(fft_length_, output_format_)),
      is_valid_(true) {
  if (fft_length_ < 2 || !IsEven(fft_length_) || 0 == input_length_ ||
      0 == output_length_) {
    is_valid_ = false;
    return;
  }
}